

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O2

uint __thiscall ON_FontList::AddFonts(ON_FontList *this,size_t font_count,ON_Font **font_list)

{
  uint uVar1;
  uint uVar2;
  size_t i;
  size_t sVar3;
  
  uVar2 = 0;
  if (font_count != 0 && font_list != (ON_Font **)0x0) {
    uVar2 = 0;
    for (sVar3 = 0; font_count != sVar3; sVar3 = sVar3 + 1) {
      uVar1 = AddFont(this,font_list[sVar3],false);
      uVar2 = uVar2 + uVar1;
    }
  }
  return uVar2;
}

Assistant:

unsigned int ON_FontList::AddFonts(
  size_t font_count,
  const ON_Font * const * font_list
)
{
  if (nullptr == font_list || font_count <= 0)
    return 0;

  unsigned int rc = 0;
  for (size_t i = 0; i < font_count; i++)
  {
    rc += AddFont(font_list[i],false);
  }
  return rc;
}